

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int mem_live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  uint uVar1;
  uint local_24;
  out_edge_t peStack_20;
  int change_p;
  edge_t_conflict e;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  local_24 = 0;
  for (peStack_20 = DLIST_out_edge_t_head(&bb->out_edges); peStack_20 != (out_edge_t)0x0;
      peStack_20 = DLIST_out_edge_t_next(peStack_20)) {
    uVar1 = bitmap_ior(bb->out,bb->out,peStack_20->dst->in);
    local_24 = uVar1 | local_24;
  }
  return local_24;
}

Assistant:

static int mem_live_con_func_n (gen_ctx_t gen_ctx MIR_UNUSED, bb_t bb) {
  edge_t e;
  int change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e))
    change_p |= bitmap_ior (bb->mem_live_out, bb->mem_live_out, e->dst->mem_live_in);
  return change_p;
}